

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_server_main.cpp
# Opt level: O2

void __thiscall settings::help(settings *this)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,
                           "usage: cppcms_scale [ -c config.js ] [ parameters ]\n  -c config.js       JSON, Configuration file, also parameters may\n                     be set via command line rather then the file\n --ip=IP             IP to bind, default 0.0.0.0\n --port=N            Port to bind, mandatory\n --threads=N         Worker threads, default = # HW CPU\n --cache-limit=N     The size of the cache in items\n --session-storage=(memory|files|external)\n                     Session storage module\n --session-gc=N      The frequency of garbage collection\n --session-dir=/path The location of files for session storage\n --session-shared_object=/path\n                     The shared object/dll that is used as external\n                     storage --session-module=name\n                     The name of the module for example mymod for\n                     an external storage, renamed to shared object\n                     according to OS conventions, like libmymod.so\n --daemon-enable=(true|false)\n                     Run the process as daemon, default false\n --daemon-lock=/path Location of the lock file that keeps process pid\n --daemon-user=user  User that the daemon should run under\n --daemon-group=grp  Group that the daemon should run under\n --daemon-chroot=/path\n                     Run the service in chroot jain\n --daemon-fdlimit=N  The limit of file descriptors for the service\n"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void help()
	{
		std::cerr <<
		"usage: cppcms_scale [ -c config.js ] [ parameters ]\n"
		"  -c config.js       JSON, Configuration file, also parameters may\n"
		"                     be set via command line rather then the file\n"
		" --ip=IP             IP to bind, default 0.0.0.0\n"
		" --port=N            Port to bind, mandatory\n"
		" --threads=N         Worker threads, default = # HW CPU\n"
		" --cache-limit=N     The size of the cache in items\n"
		" --session-storage=(memory|files|external)\n"
		"                     Session storage module\n"
		" --session-gc=N      The frequency of garbage collection\n"
		" --session-dir=/path The location of files for session storage\n"
		" --session-shared_object=/path\n"
		"                     The shared object/dll that is used as external\n"
		"                     storage"
		" --session-module=name\n"
		"                     The name of the module for example mymod for\n"
		"                     an external storage, renamed to shared object\n"
		"                     according to OS conventions, like libmymod.so\n"
#ifndef CPPCMS_WIN32
		" --daemon-enable=(true|false)\n"
		"                     Run the process as daemon, default false\n"
		" --daemon-lock=/path Location of the lock file that keeps process pid\n"
		" --daemon-user=user  User that the daemon should run under\n"
		" --daemon-group=grp  Group that the daemon should run under\n"
		" --daemon-chroot=/path\n"
		"                     Run the service in chroot jain\n"
		" --daemon-fdlimit=N  The limit of file descriptors for the service\n"
#endif
#ifdef CPPCMS_WIN_NATIVE
		" --winservice-mode=(install|uninstall)\n"
		"                     Install or uninstall windows service\n"
		" --winservice-name=XXX\n"
		"                     Name of windows service\n"
		" --winservice-display_name=XXX\n"
		"                     The service name shown in the UI\n"
		" --winservice-start=(auto|demand)\n"
		"                     Windows service start mode\n"
		" --winservice-user=XXX\n"
		" --winservice-password=XXX\n"
		"                     The user and password the service would run under\n"
#endif
		<< std::endl;
	}